

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O0

void tchecker::ts::prev<tchecker::ta::ta_t>
               (ta_t *bwd_impl,const_state_t *s,
               vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
               *v,state_status_t mask)

{
  bool bVar1;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  *peVar2;
  tuple<tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
  local_6e8;
  incoming_edges_value_t *local_690;
  incoming_edges_value_t *in_edge;
  end_iterator_t __end0;
  undefined1 local_678 [8];
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  __begin0;
  incoming_edges_range_t *__range2;
  incoming_edges_range_t in_edges;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  const_state_t *s_local;
  ta_t *bwd_impl_local;
  
  in_edges._804_4_ = mask;
  ta::ta_t::incoming_edges((incoming_edges_range_t *)&__range2,bwd_impl,s);
  __begin0._valuations_it._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__range2;
  peVar2 = range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
           ::begin((incoming_edges_range_t *)&__range2);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_678,peVar2);
  range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
  ::end((range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
         *)__begin0._valuations_it._its.
           super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    bVar1 = ta::
            edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
            ::operator!=((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                          *)local_678,(end_iterator_t *)((long)&in_edge + 3));
    if (!bVar1) break;
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator*(&local_6e8,
                (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                 *)local_678);
    local_690 = &local_6e8;
    ta::ta_t::prev(bwd_impl,s,local_690,v,in_edges._804_4_);
    std::
    tuple<tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
    ::~tuple(&local_6e8);
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator++((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                  *)local_678);
  }
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_678);
  range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
  ::~range_t((range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
              *)&__range2);
  return;
}

Assistant:

void prev(BWD_IMPL & bwd_impl, typename BWD_IMPL::const_state_t const & s, std::vector<typename BWD_IMPL::sst_t> & v,
          tchecker::state_status_t mask)
{
  typename BWD_IMPL::incoming_edges_range_t in_edges = bwd_impl.incoming_edges(s);
  for (typename BWD_IMPL::incoming_edges_value_t && in_edge : in_edges)
    bwd_impl.prev(s, in_edge, v, mask);
}